

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

void Search::allowed_actions_to_label
               (search_private *priv,size_t ec_cnt,action *allowed_actions,
               size_t allowed_actions_cnt,float *allowed_actions_cost,action *oracle_actions,
               size_t oracle_actions_cnt,polylabel *lab)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  size_t i;
  size_t sVar5;
  uint32_t uVar6;
  action k;
  ulong uVar7;
  float fVar8;
  
  bVar2 = priv->cb_learner;
  if (priv->is_ldf == true) {
    cs_costs_erase(bVar2,lab);
    uVar4 = 0;
    while (uVar3 = (uint)uVar4, uVar4 < ec_cnt) {
      bVar1 = array_contains<unsigned_int>(uVar3,oracle_actions,oracle_actions_cnt);
      fVar8 = 0.0;
      if (!bVar1) {
        fVar8 = 1.0;
      }
      cs_cost_push_back(bVar2,lab,uVar3,fVar8);
      uVar4 = (ulong)(uVar3 + 1);
    }
    return;
  }
  if (priv->use_action_costs == true) {
    if (allowed_actions != (action *)0x0) {
      cs_costs_erase(bVar2,lab);
      for (uVar3 = 0; uVar4 = (ulong)uVar3, uVar4 < allowed_actions_cnt; uVar3 = uVar3 + 1) {
        cs_cost_push_back(bVar2,lab,allowed_actions[uVar4],allowed_actions_cost[uVar4]);
      }
      return;
    }
    uVar4 = (long)(lab->cs).costs._end - (long)(lab->cs).costs._begin >> 4;
    if (uVar4 != priv->A) {
      cs_costs_erase(bVar2,lab);
      for (uVar6 = 1; uVar4 = priv->A, uVar6 - 1 < uVar4; uVar6 = uVar6 + 1) {
        cs_cost_push_back(bVar2,lab,uVar6,0.0);
      }
    }
    for (uVar3 = 0; uVar7 = (ulong)uVar3, uVar7 < uVar4; uVar3 = uVar3 + 1) {
      (lab->cs).costs._begin[uVar7].x = allowed_actions_cost[uVar7];
      uVar4 = priv->A;
    }
    return;
  }
  if (allowed_actions != (action *)0x0 && allowed_actions_cnt != 0) {
    cs_costs_erase(bVar2,lab);
    for (sVar5 = 0; allowed_actions_cnt != sVar5; sVar5 = sVar5 + 1) {
      uVar3 = allowed_actions[sVar5];
      bVar1 = array_contains<unsigned_int>(uVar3,oracle_actions,oracle_actions_cnt);
      fVar8 = 0.0;
      if (!bVar1) {
        fVar8 = 1.0;
      }
      cs_cost_push_back(bVar2,lab,uVar3,fVar8);
    }
    return;
  }
  uVar7 = (long)(lab->cs).costs._end - (long)(lab->cs).costs._begin >> 4;
  uVar4 = priv->A;
  if (uVar7 == uVar4) {
    sVar5 = uVar7;
    if (1 < oracle_actions_cnt) {
LAB_0011bd45:
      for (uVar3 = 1; uVar3 - 1 < sVar5; uVar3 = uVar3 + 1) {
        bVar2 = array_contains<unsigned_int>(uVar3,oracle_actions,oracle_actions_cnt);
        fVar8 = 0.0;
        if (!bVar2) {
          fVar8 = 1.0;
        }
        (lab->cs).costs._begin[uVar3 - 1].x = fVar8;
        sVar5 = priv->A;
      }
      return;
    }
  }
  else {
    cs_costs_erase(bVar2,lab);
    for (uVar6 = 1; sVar5 = priv->A, uVar6 - 1 < sVar5; uVar6 = uVar6 + 1) {
      cs_cost_push_back(bVar2,lab,uVar6,1.0);
    }
    if (1 < oracle_actions_cnt) goto LAB_0011bd45;
    if (uVar7 != uVar4) goto LAB_0011bcde;
  }
  for (uVar3 = 0; uVar3 < sVar5; uVar3 = uVar3 + 1) {
    (lab->cs).costs._begin[uVar3].x = 1.0;
    sVar5 = priv->A;
  }
LAB_0011bcde:
  if (oracle_actions_cnt != 1) {
    return;
  }
  (lab->cs).costs._begin[*oracle_actions - 1].x = 0.0;
  return;
}

Assistant:

void allowed_actions_to_label(search_private& priv, size_t ec_cnt, const action* allowed_actions,
    size_t allowed_actions_cnt, const float* allowed_actions_cost, const action* oracle_actions,
    size_t oracle_actions_cnt, polylabel& lab)
{
  bool isCB = priv.cb_learner;
  if (priv.is_ldf)  // LDF version easier
  {
    cs_costs_erase(isCB, lab);
    for (action k = 0; k < ec_cnt; k++)
      cs_cost_push_back(isCB, lab, k, array_contains<action>(k, oracle_actions, oracle_actions_cnt) ? 0.f : 1.f);
    // cerr << "lab = ["; for (size_t i=0; i<lab.cs.costs.size(); i++) cdbg << ' ' << lab.cs.costs[i].class_index << ':'
    // << lab.cs.costs[i].x; cdbg << " ]" << endl;
  }
  else if (priv.use_action_costs)
  {
    // TODO: Weight
    if (allowed_actions == nullptr)
    {
      if (cs_get_costs_size(isCB, lab) != priv.A)
      {
        cs_costs_erase(isCB, lab);
        for (action k = 0; k < priv.A; k++) cs_cost_push_back(isCB, lab, k + 1, 0.);
      }
      for (action k = 0; k < priv.A; k++) cs_set_cost_loss(isCB, lab, k, allowed_actions_cost[k]);
    }
    else  // manually specified actions
    {
      cs_costs_erase(isCB, lab);
      for (action k = 0; k < allowed_actions_cnt; k++)
        cs_cost_push_back(isCB, lab, allowed_actions[k], allowed_actions_cost[k]);
    }
  }
  else  // non-LDF, no action costs
  {
    if ((allowed_actions == nullptr) || (allowed_actions_cnt == 0))  // any action is allowed
    {
      bool set_to_one = false;
      if (cs_get_costs_size(isCB, lab) != priv.A)
      {
        cs_costs_erase(isCB, lab);
        for (action k = 0; k < priv.A; k++) cs_cost_push_back(isCB, lab, k + 1, 1.);
        set_to_one = true;
      }
      // cerr << "lab = ["; for (size_t i=0; i<lab.cs.costs.size(); i++) cdbg << ' ' << lab.cs.costs[i].class_index <<
      // ':' << lab.cs.costs[i].x; cdbg << " ]" << endl;
      if (oracle_actions_cnt <= 1)  // common case to speed up
      {
        if (!set_to_one)
          for (action k = 0; k < priv.A; k++) cs_set_cost_loss(isCB, lab, k, 1.);
        if (oracle_actions_cnt == 1)
          cs_set_cost_loss(isCB, lab, oracle_actions[0] - 1, 0.);
      }
      else
      {
        for (action k = 0; k < priv.A; k++)
          cs_set_cost_loss(isCB, lab, k, array_contains<action>(k + 1, oracle_actions, oracle_actions_cnt) ? 0.f : 1.f);
      }
    }
    else  // only some actions are allowed
    {
      cs_costs_erase(isCB, lab);
      float w = 1.;  // array_contains<action>(3, oracle_actions, oracle_actions_cnt) ? 5.f : 1.f;
      for (size_t i = 0; i < allowed_actions_cnt; i++)
      {
        action k = allowed_actions[i];
        cs_cost_push_back(
            isCB, lab, k, (array_contains<action>(k, oracle_actions, oracle_actions_cnt)) ? 0.f : w);  // 1.f );
      }
    }
  }
}